

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

void ASN1_put_object(uchar **pp,int constructed,int length,int tag,int xclass)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int local_30;
  int local_2c;
  int ttag;
  int i;
  uchar *p;
  int xclass_local;
  int tag_local;
  int length_local;
  int constructed_local;
  uchar **pp_local;
  
  pbVar1 = *pp;
  bVar3 = 0;
  if (constructed != 0) {
    bVar3 = 0x20;
  }
  bVar3 = (byte)xclass & 0xc0 | bVar3;
  p._4_4_ = tag;
  if (tag < 0x1f) {
    _ttag = pbVar1 + 1;
    *pbVar1 = bVar3 | (byte)tag & 0x1f;
  }
  else {
    *pbVar1 = bVar3 | 0x1f;
    local_2c = 0;
    for (local_30 = tag; iVar2 = local_2c, 0 < local_30; local_30 = local_30 >> 7) {
      local_2c = local_2c + 1;
    }
    while (iVar4 = local_2c + -1, 0 < local_2c) {
      pbVar1[(long)iVar4 + 1] = (byte)p._4_4_ & 0x7f;
      if (iVar4 != iVar2 + -1) {
        pbVar1[(long)iVar4 + 1] = pbVar1[(long)iVar4 + 1] | 0x80;
      }
      p._4_4_ = p._4_4_ >> 7;
      local_2c = iVar4;
    }
    _ttag = pbVar1 + (long)iVar2 + 1;
  }
  _length_local = pp;
  if (constructed == 2) {
    *_ttag = 0x80;
    _ttag = _ttag + 1;
  }
  else {
    p._0_4_ = xclass;
    xclass_local = length;
    tag_local = constructed;
    asn1_put_length((uchar **)&ttag,length);
  }
  *_length_local = _ttag;
  return;
}

Assistant:

void ASN1_put_object(unsigned char **pp, int constructed, int length, int tag,
                     int xclass) {
  unsigned char *p = *pp;
  int i, ttag;

  i = (constructed) ? V_ASN1_CONSTRUCTED : 0;
  i |= (xclass & V_ASN1_PRIVATE);
  if (tag < 31) {
    *(p++) = i | (tag & V_ASN1_PRIMITIVE_TAG);
  } else {
    *(p++) = i | V_ASN1_PRIMITIVE_TAG;
    for (i = 0, ttag = tag; ttag > 0; i++) {
      ttag >>= 7;
    }
    ttag = i;
    while (i-- > 0) {
      p[i] = tag & 0x7f;
      if (i != (ttag - 1)) {
        p[i] |= 0x80;
      }
      tag >>= 7;
    }
    p += ttag;
  }
  if (constructed == 2) {
    *(p++) = 0x80;
  } else {
    asn1_put_length(&p, length);
  }
  *pp = p;
}